

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O3

void Fxu_HeapSingleInsert(Fxu_HeapSingle *p,Fxu_Single *pSingle)

{
  uint uVar1;
  Fxu_Single **__ptr;
  size_t __size;
  int iVar2;
  
  iVar2 = p->nItems;
  __ptr = p->pTree;
  if (iVar2 == p->nItemsAlloc) {
    p->nItemsAlloc = iVar2 * 2;
    __size = (long)iVar2 * 0x10 + 0x50;
    if (__ptr == (Fxu_Single **)0x0) {
      __ptr = (Fxu_Single **)malloc(__size);
    }
    else {
      __ptr = (Fxu_Single **)realloc(__ptr,__size);
      iVar2 = p->nItems;
    }
    p->pTree = __ptr;
  }
  uVar1 = iVar2 + 1;
  p->nItems = uVar1;
  __ptr[(long)iVar2 + 1] = pSingle;
  pSingle->HNum = uVar1;
  Fxu_HeapSingleMoveUp(p,(Fxu_Single *)(ulong)uVar1);
  return;
}

Assistant:

void Fxu_HeapSingleInsert( Fxu_HeapSingle * p, Fxu_Single * pSingle )
{
	if ( p->nItems == p->nItemsAlloc )
		Fxu_HeapSingleResize( p );
	// put the last entry to the last place and move up
	p->pTree[++p->nItems] = pSingle;
	pSingle->HNum = p->nItems;
	// move the last entry up if necessary
	Fxu_HeapSingleMoveUp( p, pSingle );
}